

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbar_mugshot.cpp
# Opt level: O2

void __thiscall FMugShot::Tick(FMugShot *this,player_t *player)

{
  if (this->CurrentState != (FMugShotState *)0x0) {
    FMugShotState::Tick(this->CurrentState);
    if ((undefined1  [40])((undefined1  [40])*this->CurrentState & (undefined1  [40])0x10) !=
        (undefined1  [40])0x0) {
      this->bNormal = true;
      this->bOuchActive = false;
      this->CurrentState = (FMugShotState *)0x0;
    }
  }
  if (((player->attackdown == true) && ((player->cheats & 0x1040) == 0)) &&
     (player->ReadyWeapon != (AWeapon *)0x0)) {
    if (this->RampageTimer != 0x46) {
      this->RampageTimer = this->RampageTimer + 1;
    }
  }
  else {
    this->RampageTimer = 0;
  }
  this->FaceHealth = player->health;
  return;
}

Assistant:

void FMugShot::Tick(player_t *player)
{
	if (CurrentState != NULL)
	{
		CurrentState->Tick();
		if (CurrentState->bFinished)
		{
			bNormal = true;
			bOuchActive = false;
			CurrentState = NULL;
		}
	}
	if (player->attackdown && !(player->cheats & (CF_FROZEN | CF_TOTALLYFROZEN)) && player->ReadyWeapon)
	{
		if (RampageTimer != ST_RAMPAGEDELAY)
		{
			RampageTimer++;
		}
	}
	else
	{
		RampageTimer = 0;
	}
	FaceHealth = player->health;
}